

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Property.hh
# Opt level: O1

void __thiscall OpenMesh::PropertyT<short>::push_back(PropertyT<short> *this)

{
  iterator __position;
  short local_a;
  
  local_a = 0;
  __position._M_current =
       (this->data_).super__Vector_base<short,_std::allocator<short>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->data_).super__Vector_base<short,_std::allocator<short>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<short,_std::allocator<short>_>::_M_realloc_insert<short>
              (&this->data_,__position,&local_a);
  }
  else {
    *__position._M_current = 0;
    (this->data_).super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
    _M_finish = __position._M_current + 1;
  }
  return;
}

Assistant:

virtual void push_back()        { data_.push_back(T()); }